

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

void rw::memNative16_func(void *data,uint32 size)

{
  uint uVar1;
  uint16 *words;
  
  if (1 < size) {
    uVar1 = 0;
    do {
      uVar1 = uVar1 + 1;
    } while (size >> 1 != uVar1);
  }
  return;
}

Assistant:

void
memNative16_func(void *data, uint32 size)
{
	uint8 *bytes = (uint8*)data;
	uint16 *words = (uint16*)data;
	size >>= 1;
	while(size--){
		*words++ = (uint16)bytes[0] | (uint16)bytes[1]<<8;
		bytes += 2;
	}
}